

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

MergeEngine * vdbeMergeEngineNew(int nReader)

{
  int iVar1;
  int in_EDI;
  MergeEngine *pNew;
  int nByte;
  int N;
  u64 in_stack_ffffffffffffffe0;
  MergeEngine *pMVar2;
  int local_8;
  
  for (local_8 = 2; local_8 < in_EDI; local_8 = local_8 * 2) {
  }
  iVar1 = sqlite3FaultSim((int)(in_stack_ffffffffffffffe0 >> 0x20));
  if (iVar1 == 0) {
    pMVar2 = (MergeEngine *)sqlite3MallocZero(in_stack_ffffffffffffffe0);
  }
  else {
    pMVar2 = (MergeEngine *)0x0;
  }
  if (pMVar2 != (MergeEngine *)0x0) {
    pMVar2->nTree = local_8;
    pMVar2->pTask = (SortSubtask *)0x0;
    pMVar2->aReadr = (PmaReader *)(pMVar2 + 1);
    pMVar2->aTree = (int *)(pMVar2->aReadr + local_8);
  }
  return pMVar2;
}

Assistant:

static MergeEngine *vdbeMergeEngineNew(int nReader){
  int N = 2;                      /* Smallest power of two >= nReader */
  int nByte;                      /* Total bytes of space to allocate */
  MergeEngine *pNew;              /* Pointer to allocated object to return */

  assert( nReader<=SORTER_MAX_MERGE_COUNT );

  while( N<nReader ) N += N;
  nByte = sizeof(MergeEngine) + N * (sizeof(int) + sizeof(PmaReader));

  pNew = sqlite3FaultSim(100) ? 0 : (MergeEngine*)sqlite3MallocZero(nByte);
  if( pNew ){
    pNew->nTree = N;
    pNew->pTask = 0;
    pNew->aReadr = (PmaReader*)&pNew[1];
    pNew->aTree = (int*)&pNew->aReadr[N];
  }
  return pNew;
}